

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

QTextTable * __thiscall QTextCursorPrivate::complexSelectionTable(QTextCursorPrivate *this)

{
  QTextTable *pQVar1;
  QTextTable *pQVar2;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->position != this->anchor) {
    QTextDocumentPrivate::frameAt(this->priv,this->position);
    pQVar1 = (QTextTable *)QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (pQVar1 != (QTextTable *)0x0) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)&local_38,(int)pQVar1);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)&local_48,(int)pQVar1);
      pQVar2 = (QTextTable *)0x0;
      if ((int)puStack_30 != (int)puStack_40) {
        pQVar2 = pQVar1;
      }
      if (local_38 != local_48) {
        pQVar2 = pQVar1;
      }
      goto LAB_004c31ad;
    }
  }
  pQVar2 = (QTextTable *)0x0;
LAB_004c31ad:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pQVar2;
}

Assistant:

QTextTable *QTextCursorPrivate::complexSelectionTable() const
{
    if (position == anchor)
        return nullptr;

    QTextTable *t = qobject_cast<QTextTable *>(priv->frameAt(position));
    if (t) {
        QTextTableCell cell_pos = t->cellAt(position);
        QTextTableCell cell_anchor = t->cellAt(adjusted_anchor);

        Q_ASSERT(cell_anchor.isValid());

        if (cell_pos == cell_anchor)
            t = nullptr;
    }
    return t;
}